

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libelftc_dem_gnu3.c
# Opt level: O0

void copy_string(char *dst,char *src,size_t dsize)

{
  char cVar1;
  char *pcVar2;
  size_t local_28;
  size_t remain;
  size_t dsize_local;
  char *src_local;
  char *dst_local;
  
  local_28 = dsize;
  dsize_local = (size_t)src;
  src_local = dst;
  if (dsize != 0) {
    do {
      local_28 = local_28 - 1;
      if (local_28 == 0) break;
      cVar1 = *(char *)dsize_local;
      pcVar2 = src_local + 1;
      *src_local = cVar1;
      dsize_local = dsize_local + 1;
      src_local = pcVar2;
    } while (cVar1 != '\0');
  }
  if ((local_28 == 0) && (dsize != 0)) {
    *src_local = '\0';
  }
  return;
}

Assistant:

static void
copy_string(char *dst, const char *src, size_t dsize)
{
	size_t remain;
	if ((remain = dsize))
		while (--remain)
			if (!(*dst++ = *src++))
				break;
	if (!remain && dsize)
                *dst = 0;
}